

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_pit_mon_base(parser *p)

{
  void *pvVar1;
  char *name;
  monster_base *pmVar2;
  undefined8 *puVar3;
  monster_base *base;
  pit_monster_profile *bases;
  pit_profile *pit;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  name = parser_getsym(p,"base");
  pmVar2 = lookup_monster_base(name);
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else if (pmVar2 == (monster_base *)0x0) {
    p_local._4_4_ = PARSE_ERROR_UNRECOGNISED_TVAL;
  }
  else {
    puVar3 = (undefined8 *)mem_zalloc(0x10);
    puVar3[1] = pmVar2;
    *puVar3 = *(undefined8 *)((long)pvVar1 + 0x60);
    *(undefined8 **)((long)pvVar1 + 0x60) = puVar3;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_pit_mon_base(struct parser *p) {
	struct pit_profile *pit = parser_priv(p);
	struct pit_monster_profile *bases;
	struct monster_base *base = lookup_monster_base(parser_getsym(p, "base"));

	if (!pit)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	else if (!base)
		return PARSE_ERROR_UNRECOGNISED_TVAL;

	bases = mem_zalloc(sizeof *bases);
	bases->base = base;
	bases->next = pit->bases;
	pit->bases = bases;
	return PARSE_ERROR_NONE;
}